

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionSet::SelectionSet(SelectionSet *this,vector<int,_std::allocator<int>_> *nbits)

{
  OpenMDBitSet *in_RSI;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDI;
  int i;
  OpenMDBitSet *in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffb8;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  OpenMDBitSet *in_stack_ffffffffffffffd0;
  undefined4 local_20;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)0x37c90a);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::resize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RSI,(long)local_20);
    OpenMDBitSet::OpenMDBitSet(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RDI,(long)local_20);
    OpenMDBitSet::operator=(in_RSI,in_stack_ffffffffffffff98);
    OpenMDBitSet::~OpenMDBitSet((OpenMDBitSet *)0x37c96e);
  }
  clearAll((SelectionSet *)in_RSI);
  return;
}

Assistant:

SelectionSet::SelectionSet(std::vector<int> nbits) {
    bitsets_.resize(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i] = OpenMDBitSet(nbits[i]);
    clearAll();
  }